

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmAdda<(moira::Instr)2,(moira::Mode)11,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  Ea<(moira::Mode)11,_4> src;
  u32 local_3c;
  ushort local_38;
  uint local_34;
  
  local_38 = op & 7;
  local_3c = *addr;
  *addr = local_3c + 2;
  iVar4 = (*this->_vptr_Moira[6])();
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[6])(this);
  local_34 = uVar5 & 0xffff | iVar4 << 0x10;
  cVar3 = 'a';
  lVar6 = 0;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar3;
    cVar3 = "adda"[lVar6 + 1];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  if (str->style->syntax - MOIRA_MIT < 3) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = 'l';
  }
  else {
    cVar3 = '.';
    lVar6 = 0;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar3;
      cVar3 = "$%x.l"[lVar6 + 4];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
  }
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    iVar4 = (str->tab).raw;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    } while (str->ptr < str->base + iVar4);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)11,_4> *)&local_3c);
  pcVar2 = str->ptr;
  str->ptr = pcVar2 + 1;
  *pcVar2 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  StrWriter::operator<<(str,(An)(op >> 9 & 7));
  return;
}

Assistant:

void
Moira::dasmAdda(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = An       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}